

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O2

uint32_t __thiscall IndexTree::allocateNode(IndexTree *this)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  uint *puVar5;
  
  puVar5 = this->node_count;
  uVar2 = *puVar5;
  if (this->current_capacity <= uVar2) {
    iVar3 = ftruncate(this->index_file_fd,this->index_file_size * 2);
    if (iVar3 != 0) {
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/index_tree.cc"
                    ,0xe9,"uint32_t IndexTree::allocateNode()");
    }
    pvVar4 = mremap(this->file_map,this->index_file_size,this->index_file_size * 2,1);
    this->file_map = pvVar4;
    if (pvVar4 == (void *)0xffffffffffffffff) {
      __assert_fail("file_map != MAP_FAILED",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/index_tree.cc"
                    ,0xeb,"uint32_t IndexTree::allocateNode()");
    }
    sVar1 = this->index_file_size * 2;
    this->index_file_size = sVar1;
    this->current_capacity = ((int)sVar1 - 8U) / 0x41c;
    initFileMap(this);
    puVar5 = this->node_count;
    uVar2 = *puVar5;
  }
  *puVar5 = uVar2 + 1;
  return uVar2;
}

Assistant:

uint32_t IndexTree::allocateNode() {
    if (__glibc_unlikely(*node_count >= current_capacity)) {
//        printf("Re-mapping index file to extend size\n");
        // extend the index file size
        int ret = ftruncate(index_file_fd, index_file_size * 2);
        assert(ret == 0);
        file_map = mremap(file_map, index_file_size, index_file_size * 2, MREMAP_MAYMOVE);
        assert(file_map != MAP_FAILED);
        index_file_size *= 2;
        current_capacity = (uint32_t) (index_file_size - 2 * sizeof(uint32_t)) / sizeof(Node);
        initFileMap();
    }
    *node_count += 1;
    return *node_count - 1;
}